

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::BindUniformBuffer
          (GLContextState *this,Int32 Index,GLBufferObj *Buff,GLintptr Offset,GLsizeiptr Size)

{
  GLuint GVar1;
  bool bVar2;
  UniqueIdentifier _BufferID;
  Char *pCVar3;
  size_type sVar4;
  reference pvVar5;
  undefined1 local_a0 [8];
  string msg_1;
  GLenum err;
  GLuint GLBufferHandle;
  BoundBufferInfo NewUBOInfo;
  undefined1 local_50 [8];
  string msg;
  GLsizeiptr Size_local;
  GLintptr Offset_local;
  GLBufferObj *Buff_local;
  GLContextState *pGStack_10;
  Int32 Index_local;
  GLContextState *this_local;
  
  msg.field_2._8_8_ = Size;
  Buff_local._4_4_ = Index;
  pGStack_10 = this;
  if ((Index < 0) || ((this->m_Caps).MaxUniformBufferBindings <= Index)) {
    FormatString<char[37]>((string *)local_50,(char (*) [37])"Uniform buffer index is out of range")
    ;
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BindUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x165);
    std::__cxx11::string::~string((string *)local_50);
  }
  _BufferID = GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::
              GetUniqueID(Buff);
  BoundBufferInfo::BoundBufferInfo((BoundBufferInfo *)&err,_BufferID,Offset,msg.field_2._8_8_);
  GVar1 = Buff_local._4_4_;
  sVar4 = std::
          vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
          ::size(&this->m_BoundUniformBuffers);
  if ((int)sVar4 <= (int)GVar1) {
    std::
    vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
    ::resize(&this->m_BoundUniformBuffers,(long)(int)Buff_local._4_4_ + 1);
  }
  pvVar5 = std::
           vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
           ::operator[](&this->m_BoundUniformBuffers,(long)(int)Buff_local._4_4_);
  bVar2 = BoundBufferInfo::operator!=(pvVar5,(BoundBufferInfo *)&err);
  if (bVar2) {
    pvVar5 = std::
             vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
             ::operator[](&this->m_BoundUniformBuffers,(long)(int)Buff_local._4_4_);
    pvVar5->BufferID = err;
    *(GLuint *)&pvVar5->field_0x4 = GLBufferHandle;
    pvVar5->Offset = NewUBOInfo._0_8_;
    pvVar5->Size = NewUBOInfo.Offset;
    msg_1.field_2._12_4_ =
         GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)Buff);
    (*__glewBindBufferRange)(0x8a11,Buff_local._4_4_,msg_1.field_2._12_4_,Offset,msg.field_2._8_8_);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[39],int,char[17],unsigned_int>
                (false,"BindUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x172,(char (*) [39])"Failed to bind uniform buffer to slot ",
                 (int *)((long)&Buff_local + 4),(char (*) [17])"\nGL Error Code: ",
                 (uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_a0,(char (*) [6])0xe8e72e);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"BindUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x172);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  return;
}

Assistant:

void GLContextState::BindUniformBuffer(Int32 Index, const GLObjectWrappers::GLBufferObj& Buff, GLintptr Offset, GLsizeiptr Size)
{
    VERIFY(0 <= Index && Index < m_Caps.MaxUniformBufferBindings, "Uniform buffer index is out of range");

    BoundBufferInfo NewUBOInfo{Buff.GetUniqueID(), Offset, Size};
    if (Index >= static_cast<Int32>(m_BoundUniformBuffers.size()))
        m_BoundUniformBuffers.resize(static_cast<size_t>(Index) + 1);

    if (m_BoundUniformBuffers[Index] != NewUBOInfo)
    {
        m_BoundUniformBuffers[Index] = NewUBOInfo;
        GLuint GLBufferHandle        = Buff;
        // In addition to binding buffer to the indexed buffer binding target, glBindBufferBase also binds
        // buffer to the generic buffer binding point specified by target.
        glBindBufferRange(GL_UNIFORM_BUFFER, Index, GLBufferHandle, Offset, Size);
        DEV_CHECK_GL_ERROR("Failed to bind uniform buffer to slot ", Index);
    }
}